

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::AddFile
          (ImportWriter *this,FileDescriptor *file,string *header_extension)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  undefined8 *puVar4;
  iterator iVar5;
  size_type *psVar6;
  FileDescriptor *file_00;
  FileDescriptor *file_01;
  FileDescriptor *file_02;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  string header_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_a8;
  value_type local_88;
  string local_68;
  string local_48;
  
  bVar3 = IsProtobufLibraryBundledProtoFile(file);
  if (bVar3) {
    if (this->include_wkt_imports_ != true) {
      return;
    }
    FilePathBasename_abi_cxx11_(&local_68,(objectivec *)file,file_00);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x3e5733);
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8.field_2._8_8_ = puVar4[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_a8._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_a8,(ulong)(header_extension->_M_dataplus)._M_p);
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_88.field_2._M_allocated_capacity = *psVar6;
      local_88.field_2._8_8_ = puVar4[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar6;
      local_88._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_88._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->protobuf_imports_,&local_88);
    _Var8._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return;
    }
    goto LAB_00271909;
  }
  if (this->need_to_parse_mapping_file_ == true) {
    ParseFrameworkMappings(this);
  }
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->proto_file_to_framework_name_)._M_t,*(key_type **)file);
  if ((_Rb_tree_header *)iVar5._M_node ==
      &(this->proto_file_to_framework_name_)._M_t._M_impl.super__Rb_tree_header) {
    sVar1 = (this->generate_for_named_framework_)._M_string_length;
    if (sVar1 == 0) {
      FilePath_abi_cxx11_(&local_a8,(objectivec *)file,(FileDescriptor *)0x0);
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_a8,(ulong)(header_extension->_M_dataplus)._M_p);
      psVar6 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_88.field_2._M_allocated_capacity = *psVar6;
        local_88.field_2._8_8_ = puVar4[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar6;
        local_88._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_88._M_string_length = puVar4[1];
      *puVar4 = psVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_imports_,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      _Var8._M_p = local_a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
        return;
      }
      goto LAB_00271909;
    }
    pcVar2 = (this->generate_for_named_framework_)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)&local_68);
    FilePathBasename_abi_cxx11_(&local_48,(objectivec *)file,file_02);
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar7 = local_68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_48._M_string_length + local_68._M_string_length) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        uVar7 = local_48.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_48._M_string_length + local_68._M_string_length) goto LAB_00271638;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_48,0,(char *)0x0,(ulong)local_68._M_dataplus._M_p);
    }
    else {
LAB_00271638:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48._M_dataplus._M_p);
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8.field_2._8_8_ = puVar4[3];
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_a8._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)psVar6 = 0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_a8,(ulong)(header_extension->_M_dataplus)._M_p);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_88.field_2._M_allocated_capacity = *psVar6;
      local_88.field_2._8_8_ = puVar4[3];
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar6;
      local_88._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_88._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->other_framework_imports_,&local_88);
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,*(long *)(iVar5._M_node + 2),
               (long)&(iVar5._M_node[2]._M_parent)->_M_color + *(long *)(iVar5._M_node + 2));
    std::__cxx11::string::append((char *)&local_68);
    FilePathBasename_abi_cxx11_(&local_48,(objectivec *)file,file_01);
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar7 = local_68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_48._M_string_length + local_68._M_string_length) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        uVar7 = local_48.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_48._M_string_length + local_68._M_string_length) goto LAB_0027159b;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_48,0,(char *)0x0,(ulong)local_68._M_dataplus._M_p);
    }
    else {
LAB_0027159b:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48._M_dataplus._M_p);
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8.field_2._8_8_ = puVar4[3];
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar6;
      local_a8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_a8._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)psVar6 = 0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_a8,(ulong)(header_extension->_M_dataplus)._M_p);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    psVar6 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_88.field_2._M_allocated_capacity = *psVar6;
      local_88.field_2._8_8_ = puVar4[3];
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar6;
      local_88._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_88._M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->other_framework_imports_,&local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  _Var8._M_p = local_68._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return;
  }
LAB_00271909:
  operator_delete(_Var8._M_p);
  return;
}

Assistant:

void ImportWriter::AddFile(const FileDescriptor* file,
                           const std::string& header_extension) {
  if (IsProtobufLibraryBundledProtoFile(file)) {
    // The imports of the WKTs are only needed within the library itself,
    // in other cases, they get skipped because the generated code already
    // import GPBProtocolBuffers.h and hence proves them.
    if (include_wkt_imports_) {
      const std::string header_name =
          "GPB" + FilePathBasename(file) + header_extension;
      protobuf_imports_.push_back(header_name);
    }
    return;
  }

  // Lazy parse any mappings.
  if (need_to_parse_mapping_file_) {
    ParseFrameworkMappings();
  }

  std::map<std::string, std::string>::iterator proto_lookup =
      proto_file_to_framework_name_.find(file->name());
  if (proto_lookup != proto_file_to_framework_name_.end()) {
    other_framework_imports_.push_back(
        proto_lookup->second + "/" +
        FilePathBasename(file) + header_extension);
    return;
  }

  if (!generate_for_named_framework_.empty()) {
    other_framework_imports_.push_back(
        generate_for_named_framework_ + "/" +
        FilePathBasename(file) + header_extension);
    return;
  }

  other_imports_.push_back(FilePath(file) + header_extension);
}